

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O3

int deMemPool_getCapacity(deMemPool *pool,deBool recurse)

{
  int iVar1;
  MemPage *pMVar2;
  int iVar3;
  deMemPool *pool_00;
  
  iVar3 = 0;
  for (pMVar2 = pool->currentPage; pMVar2 != (MemPage *)0x0; pMVar2 = pMVar2->nextPage) {
    iVar3 = iVar3 + pMVar2->capacity;
  }
  if (recurse != 0) {
    for (pool_00 = pool->firstChild; pool_00 != (deMemPool *)0x0; pool_00 = pool_00->nextPool) {
      iVar1 = deMemPool_getCapacity(pool_00,1);
      iVar3 = iVar3 + iVar1;
    }
  }
  return iVar3;
}

Assistant:

int deMemPool_getCapacity (const deMemPool* pool, deBool recurse)
{
	int			numCapacityBytes = 0;
	MemPage*	memPage;

	for (memPage = pool->currentPage; memPage; memPage = memPage->nextPage)
		numCapacityBytes += memPage->capacity;

	if (recurse)
	{
		deMemPool* child;
		for (child = pool->firstChild; child; child = child->nextPool)
			numCapacityBytes += deMemPool_getCapacity(child, DE_TRUE);
	}

	return numCapacityBytes;
}